

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O1

void ogt_mesh_smooth_normals(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  ogt_mesh_vertex *poVar1;
  long lVar2;
  uint32_t *puVar3;
  size_t __size;
  undefined1 auVar4 [16];
  bool bVar5;
  uint *__s;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  ogt_mesh_vertex *poVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  ogt_mesh_vertex *poVar16;
  uint uVar17;
  bool bVar18;
  long lVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 local_58 [16];
  
  if ((ulong)mesh->vertex_count == 0) {
    __s = (uint *)0x0;
  }
  else {
    sVar14 = (ulong)mesh->vertex_count << 2;
    if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
      __s = (uint *)malloc(sVar14);
    }
    else {
      __s = (uint *)(*ctx->alloc_func)(sVar14,ctx->alloc_free_user_data);
    }
  }
  memset(__s,0xff,(ulong)mesh->vertex_count << 2);
  uVar8 = 1;
  do {
    uVar7 = uVar8;
    uVar17 = (uint)uVar7;
    uVar8 = (ulong)(uVar17 * 2);
  } while (uVar17 < mesh->vertex_count);
  sVar14 = uVar7 << 2;
  uVar11 = uVar17 - 1;
  if (uVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
    pvVar6 = malloc(sVar14);
  }
  else {
    pvVar6 = (*ctx->alloc_func)(sVar14,ctx->alloc_free_user_data);
  }
  memset(pvVar6,0xff,sVar14);
  if (mesh->vertex_count != 0) {
    poVar1 = mesh->vertices;
    uVar8 = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_58._0_8_;
    local_58 = auVar4 << 0x40;
    puVar10 = __s;
    poVar12 = poVar1;
    do {
      auVar4 = local_58;
      poVar16 = poVar1 + uVar8;
      lVar19 = 0;
      uVar17 = 0;
      do {
        uVar13 = *(int *)((long)&(poVar12->pos).x + lVar19) * 0x5bd1e995;
        uVar17 = uVar17 * 0x5bd1e995 ^ (uVar13 >> 0x18 ^ uVar13) * 0x5bd1e995;
        lVar19 = lVar19 + 4;
      } while ((int)lVar19 != 0xc);
      uVar7 = (ulong)(uVar17 & uVar11);
      bVar18 = false;
      uVar17 = 0;
      puVar9 = puVar10;
      do {
        puVar10 = (uint *)((long)pvVar6 + uVar7 * 4);
        uVar15 = (ulong)*puVar10;
        if (uVar15 == 0xffffffff) {
LAB_0010a3f1:
          bVar5 = false;
        }
        else {
          lVar19._0_4_ = (poVar16->pos).x;
          lVar19._4_4_ = (poVar16->pos).y;
          lVar2._0_4_ = poVar1[uVar15].pos.x;
          lVar2._4_4_ = poVar1[uVar15].pos.y;
          if ((poVar16->pos).z == poVar1[uVar15].pos.z && lVar19 == lVar2) {
            if (uVar8 <= uVar15) {
              __assert_fail("*existing_index < vertex_index",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,0x198,
                            "uint32_t *hash_table_find_vertex_position(uint32_t *, uint32_t, const ogt_mesh_vertex *, uint32_t)"
                           );
            }
            goto LAB_0010a3f1;
          }
          uVar7 = (ulong)((int)uVar7 + uVar17 + 1 & uVar11);
          bVar5 = true;
          puVar10 = puVar9;
        }
        if (!bVar5) break;
        uVar17 = uVar17 + 1;
        bVar18 = uVar11 < uVar17;
        puVar9 = puVar10;
      } while (uVar17 <= uVar11);
      if (bVar18) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                      ,0x19f,
                      "uint32_t *hash_table_find_vertex_position(uint32_t *, uint32_t, const ogt_mesh_vertex *, uint32_t)"
                     );
      }
      if ((ulong)*puVar10 == 0xffffffff) {
        *puVar10 = (uint)uVar8;
        uVar17 = local_58._0_4_;
        local_58._4_4_ = 0;
        local_58._0_4_ = uVar17 + 1;
        local_58._8_8_ = auVar4._8_8_;
      }
      else {
        uVar17 = __s[*puVar10];
        if (uVar17 == 0xffffffff) {
          __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,499,
                        "void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context *, ogt_mesh *)"
                       );
        }
      }
      __s[uVar8] = uVar17;
      uVar8 = uVar8 + 1;
      poVar12 = poVar12 + 1;
    } while (uVar8 < mesh->vertex_count);
  }
  if (pvVar6 != (void *)0x0) {
    if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
      free(pvVar6);
    }
    else {
      (*ctx->free_func)(pvVar6,ctx->alloc_free_user_data);
    }
  }
  if ((ulong)mesh->vertex_count == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    __size = (ulong)mesh->vertex_count * 0xc;
    if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
      pvVar6 = malloc(__size);
    }
    else {
      pvVar6 = (*ctx->alloc_func)(__size,ctx->alloc_free_user_data);
    }
  }
  uVar8 = 0;
  memset(pvVar6,0,(ulong)mesh->vertex_count * 0xc);
  if (mesh->index_count != 0) {
    do {
      puVar3 = mesh->indices;
      iVar20 = (int)uVar8;
      uVar17 = puVar3[uVar8];
      uVar11 = puVar3[iVar20 + 1];
      uVar13 = puVar3[iVar20 + 2];
      poVar1 = mesh->vertices;
      uVar15 = (ulong)__s[uVar17];
      fVar26 = poVar1[uVar17].pos.x;
      fVar22 = poVar1[uVar17].pos.y;
      uVar7 = (ulong)__s[uVar11];
      fVar27 = poVar1[uVar17].pos.z;
      uVar8 = (ulong)__s[uVar13];
      fVar24 = poVar1[uVar11].pos.x - fVar26;
      fVar25 = poVar1[uVar11].pos.y - fVar22;
      fVar21 = poVar1[uVar11].pos.z - fVar27;
      fVar26 = poVar1[uVar13].pos.x - fVar26;
      fVar22 = poVar1[uVar13].pos.y - fVar22;
      fVar27 = poVar1[uVar13].pos.z - fVar27;
      fVar23 = fVar25 * fVar27 - fVar22 * fVar21;
      fVar25 = fVar22 * fVar24 - fVar26 * fVar25;
      fVar22 = fVar21 * fVar26 - fVar27 * fVar24;
      fVar26 = *(float *)((long)pvVar6 + uVar15 * 0xc + 8);
      *(ulong *)((long)pvVar6 + uVar15 * 0xc) =
           CONCAT44(*(float *)((long)pvVar6 + uVar15 * 0xc + 4) + fVar22,
                    *(float *)((long)pvVar6 + uVar15 * 0xc) + fVar23);
      *(float *)((long)pvVar6 + uVar15 * 0xc + 8) = fVar26 + fVar25;
      fVar26 = *(float *)((long)pvVar6 + uVar7 * 0xc + 8);
      *(ulong *)((long)pvVar6 + uVar7 * 0xc) =
           CONCAT44(*(float *)((long)pvVar6 + uVar7 * 0xc + 4) + fVar22,
                    *(float *)((long)pvVar6 + uVar7 * 0xc) + fVar23);
      *(float *)((long)pvVar6 + uVar7 * 0xc + 8) = fVar26 + fVar25;
      fVar26 = *(float *)((long)pvVar6 + uVar8 * 0xc + 8);
      *(ulong *)((long)pvVar6 + uVar8 * 0xc) =
           CONCAT44(fVar22 + *(float *)((long)pvVar6 + uVar8 * 0xc + 4),
                    fVar23 + *(float *)((long)pvVar6 + uVar8 * 0xc));
      *(float *)((long)pvVar6 + uVar8 * 0xc + 8) = fVar25 + fVar26;
      uVar8 = (ulong)(iVar20 + 3U);
    } while (iVar20 + 3U < mesh->index_count);
  }
  if (mesh->vertex_count != 0) {
    lVar19 = 5;
    uVar8 = 0;
    do {
      uVar7 = (ulong)__s[uVar8];
      fVar26 = *(float *)((long)pvVar6 + uVar7 * 0xc);
      fVar22 = *(float *)((long)pvVar6 + uVar7 * 0xc + 4);
      fVar27 = *(float *)((long)pvVar6 + uVar7 * 0xc + 8);
      fVar21 = fVar27 * fVar27 + fVar26 * fVar26 + fVar22 * fVar22;
      if (0.001 < fVar21) {
        if (fVar21 < 0.0) {
          fVar21 = sqrtf(fVar21);
        }
        else {
          fVar21 = SQRT(fVar21);
        }
        if (fVar21 <= 0.0) {
          __assert_fail("len > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,0x127,"ogt_mesh_vec3 _normalize3(const ogt_mesh_vec3 &)");
        }
        fVar21 = 1.0 / fVar21;
        poVar1 = mesh->vertices;
        *(ulong *)((long)poVar1 + lVar19 * 4 + -8) = CONCAT44(fVar22 * fVar21,fVar26 * fVar21);
        (&(poVar1->pos).x)[lVar19] = fVar27 * fVar21;
      }
      uVar8 = uVar8 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar8 < mesh->vertex_count);
  }
  if (pvVar6 != (void *)0x0) {
    if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
      free(pvVar6);
    }
    else {
      (*ctx->free_func)(pvVar6,ctx->alloc_free_user_data);
    }
  }
  if (__s == (uint *)0x0) {
    return;
  }
  if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
    free(__s);
    return;
  }
  (*ctx->free_func)(__s,ctx->alloc_free_user_data);
  return;
}

Assistant:

void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    // generate an remap table for vertex indices based on the vertex positions.
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * mesh->vertex_count);
    memset(remap_indices, -1, mesh->vertex_count * sizeof(uint32_t));
    {
        // allocate a hash table that is sized at the next power of 2 above the vertex count
        uint32_t hash_table_size = 1;
        while (hash_table_size < mesh->vertex_count)
            hash_table_size *= 2;
        uint32_t hash_table_mask = hash_table_size - 1;
        uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
        memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

        // create a unique mapping for each vertex based purely on its position
        uint32_t num_unique_vertices = 0;
        for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
            uint32_t* hash_table_entry = hash_table_find_vertex_position(hash_table, hash_table_mask, mesh->vertices, vertex_index);
            if (*hash_table_entry == UINT32_MAX) {
                // vertex is not already in the hash table. allocate a unique index for it.
                *hash_table_entry = vertex_index;
                remap_indices[vertex_index] = num_unique_vertices++;
            }
            else {
                // vertex is already in the hash table. Point this to the index that is already existing!
                assert(remap_indices[*hash_table_entry] != UINT32_MAX);
                remap_indices[vertex_index] = remap_indices[*hash_table_entry];
            }
        }
        // now that we have remap_indices, we no longer need the hash table. 
        _voxel_meshify_free(ctx, hash_table);
    }

    // for each triangle face, add the normal of the face to the unique normal for the vertex
    ogt_mesh_vec3* remap_normals = (ogt_mesh_vec3*)_voxel_meshify_malloc(ctx, sizeof(ogt_mesh_vec3) * mesh->vertex_count);
    memset(remap_normals, 0, sizeof(ogt_mesh_vec3) * mesh->vertex_count);

    for (uint32_t i = 0; i < mesh->index_count; i += 3) {
        uint32_t i0 = mesh->indices[i + 0];
        uint32_t i1 = mesh->indices[i + 1];
        uint32_t i2 = mesh->indices[i + 2];
        ogt_mesh_vertex v0 = mesh->vertices[i0];
        ogt_mesh_vertex v1 = mesh->vertices[i1];
        ogt_mesh_vertex v2 = mesh->vertices[i2];
        ogt_mesh_vec3 normal = _cross3(_sub3(v1.pos, v0.pos), _sub3(v2.pos, v0.pos));

        uint32_t ri0 = remap_indices[i0];
        uint32_t ri1 = remap_indices[i1];
        uint32_t ri2 = remap_indices[i2];
        remap_normals[ri0] = _add3(remap_normals[ri0], normal);
        remap_normals[ri1] = _add3(remap_normals[ri1], normal);
        remap_normals[ri2] = _add3(remap_normals[ri2], normal);
    }

    // for each vertex, copy over remap normal if it's non-zero.
    for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
        ogt_mesh_vec3 accumulated_normal = remap_normals[remap_indices[vertex_index]];
        if (_dot3(accumulated_normal, accumulated_normal) > 0.001f)
            mesh->vertices[vertex_index].normal = _normalize3(accumulated_normal);
    }

    _voxel_meshify_free(ctx, remap_normals);
    _voxel_meshify_free(ctx, remap_indices);
}